

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_enc_refpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 bpno,OPJ_INT32 one,
               OPJ_INT32 *nmsedec,OPJ_BYTE type,OPJ_UINT32 ci)

{
  OPJ_INT16 OVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 x;
  OPJ_UINT32 ctxt;
  OPJ_UINT32 shift_flags;
  opj_mqc_t *mqc;
  OPJ_UINT32 v;
  OPJ_INT32 *nmsedec_local;
  OPJ_INT32 one_local;
  OPJ_INT32 bpno_local;
  OPJ_INT32 *datap_local;
  opj_flag_t *flagsp_local;
  opj_t1_t *t1_local;
  
  uVar2 = *flagsp >> ((char)ci * '\x03' & 0x1fU);
  if ((uVar2 & 0x200010) == 0x10) {
    OVar3 = opj_t1_getctxno_mag(uVar2);
    x = opj_int_abs(*datap);
    OVar1 = opj_t1_getnmsedec_ref(x,bpno);
    *nmsedec = (int)OVar1 + *nmsedec;
    uVar2 = opj_int_abs(*datap);
    uVar2 = (uint)((uVar2 & one) != 0);
    (t1->mqc).curctx = (t1->mqc).ctxs + OVar3;
    if (type == '\x01') {
      opj_mqc_bypass_enc(&t1->mqc,uVar2);
    }
    else {
      opj_mqc_encode(&t1->mqc,uVar2);
    }
    *flagsp = 0x100000 << ((char)ci * '\x03' & 0x1fU) | *flagsp;
  }
  return;
}

Assistant:

static INLINE void opj_t1_enc_refpass_step(opj_t1_t *t1,
        opj_flag_t *flagsp,
        OPJ_INT32 *datap,
        OPJ_INT32 bpno,
        OPJ_INT32 one,
        OPJ_INT32 *nmsedec,
        OPJ_BYTE type,
        OPJ_UINT32 ci)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */

    OPJ_UINT32 const shift_flags =
        (*flagsp >> (ci * 3U));

    if ((shift_flags & (T1_SIGMA_THIS | T1_PI_THIS)) == T1_SIGMA_THIS) {
        OPJ_UINT32 ctxt = opj_t1_getctxno_mag(shift_flags);
        *nmsedec += opj_t1_getnmsedec_ref((OPJ_UINT32)opj_int_abs(*datap),
                                          (OPJ_UINT32)bpno);
        v = (opj_int_abs(*datap) & one) ? 1 : 0;
#ifdef DEBUG_ENC_REF
        fprintf(stderr, "  ctxt=%d\n", ctxt);
#endif
        opj_mqc_setcurctx(mqc, ctxt);
        if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
            opj_mqc_bypass_enc(mqc, v);
        } else {
            opj_mqc_encode(mqc, v);
        }
        *flagsp |= T1_MU_THIS << (ci * 3U);
    }
}